

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_local(REF_NODE ref_node,REF_GLOB global,REF_INT *local)

{
  REF_STATUS RVar1;
  undefined8 in_RAX;
  REF_INT location;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  *local = -1;
  RVar1 = ref_sort_search_glob(ref_node->n,ref_node->sorted_global,global,&local_14);
  if (RVar1 == 0) {
    if ((long)local_14 == -1) {
      RVar1 = 5;
    }
    else {
      *local = ref_node->sorted_local[local_14];
      RVar1 = 0;
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_local(REF_NODE ref_node, REF_GLOB global,
                                  REF_INT *local) {
  REF_INT location;

  (*local) = REF_EMPTY;

  RAISE(ref_sort_search_glob(ref_node_n(ref_node), ref_node->sorted_global,
                             global, &location));

  if ((location) == REF_EMPTY) return REF_NOT_FOUND;

  (*local) = ref_node->sorted_local[location];

  return REF_SUCCESS;
}